

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

insert_return_type * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *this,node_type *node)

{
  size_t hashval;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  undefined1 auVar1 [16];
  ctrl_t *pcVar2;
  ulong uVar3;
  insert_return_type res;
  insert_return_type local_48;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ).alloc_.super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_>._M_engaged == false)
  {
    (__return_storage_ptr__->position).it_end_.ctrl_ = (ctrl_t *)0x0;
    (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
    (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
    (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
    __return_storage_ptr__->inserted = false;
    *(bool *)((long)&(__return_storage_ptr__->node).
                     super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                     .alloc_.
                     super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                     .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> + 1)
         = false;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(node->
                                 super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                                 ).slot_space_.data;
    hashval = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
    uVar3 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                     (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) *
                   0x30);
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + uVar3);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::insert(&local_48,this_00,node,hashval);
    pcVar2 = (ctrl_t *)
             (*(long *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + uVar3) +
             *(long *)((long)&(this->sets_)._M_elems[0].set_.capacity_ + uVar3));
    if (pcVar2 == local_48.position.ctrl_) {
      (__return_storage_ptr__->position).it_end_.ctrl_ = (ctrl_t *)0x0;
      (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
      (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
    }
    else {
      (__return_storage_ptr__->position).inner_ = (Inner *)this_00;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)(this + 1);
      (__return_storage_ptr__->position).it_.ctrl_ = local_48.position.ctrl_;
      (__return_storage_ptr__->position).it_.field_1 = local_48.position.field_1;
      (__return_storage_ptr__->position).it_end_.ctrl_ = pcVar2;
    }
    __return_storage_ptr__->inserted = local_48.inserted;
    if (local_48.inserted == true) {
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                       .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> +
               1) = false;
    }
    else {
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                       .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> +
               1) = false;
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ::operator=(&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                  ,&local_48.node.
                    super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                 );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) 
            return {end(), false, node_type()};
        auto& key      = node.key();
        size_t hashval = this->hash(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;

        UniqueLock m(inner);
        auto   res  = set.insert(std::move(node), hashval);
        return { make_iterator(&inner, res.position),
                 res.inserted,
                 res.inserted ? node_type() : std::move(res.node) };
    }